

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O1

void __thiscall EnvmapImage::EnvmapImage(EnvmapImage *this,Envmap type,Box2i *dataWindow)

{
  Rgba *pRVar1;
  int iVar2;
  int iVar3;
  
  this->_type = type;
  (this->_dataWindow).min = dataWindow->min;
  (this->_dataWindow).max = dataWindow->max;
  iVar2 = ((dataWindow->max).x - (dataWindow->min).x) + 1;
  iVar3 = ((dataWindow->max).y - (dataWindow->min).y) + 1;
  *(int *)&(this->_pixels)._sizeX = iVar3;
  *(uint *)((long)&(this->_pixels)._sizeX + 4) = -(uint)(iVar3 < 0);
  *(int *)&(this->_pixels)._sizeY = iVar2;
  *(uint *)((long)&(this->_pixels)._sizeY + 4) = -(uint)(iVar2 < 0);
  pRVar1 = (Rgba *)operator_new__(-(ulong)((ulong)((long)iVar3 * (long)iVar2) >> 0x3d != 0) |
                                  (long)iVar3 * (long)iVar2 * 8);
  (this->_pixels)._data = pRVar1;
  clear(this);
  return;
}

Assistant:

EnvmapImage::EnvmapImage (Envmap type, const Box2i& dataWindow)
    : _type (type)
    , _dataWindow (dataWindow)
    , _pixels (
          dataWindow.max.y - dataWindow.min.y + 1,
          dataWindow.max.x - dataWindow.min.x + 1)
{
    clear ();
}